

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowBase.cpp
# Opt level: O1

void __thiscall sf::WindowBase::initialize(WindowBase *this)

{
  WindowImpl *pWVar1;
  Vector2u VVar2;
  uint extraout_var;
  
  pWVar1 = this->m_impl;
  if (pWVar1 != (WindowImpl *)0x0) {
    (*pWVar1->_vptr_WindowImpl[9])(pWVar1,1);
  }
  pWVar1 = this->m_impl;
  if (pWVar1 != (WindowImpl *)0x0) {
    (*pWVar1->_vptr_WindowImpl[10])(pWVar1,1);
  }
  pWVar1 = this->m_impl;
  if (pWVar1 != (WindowImpl *)0x0) {
    (*pWVar1->_vptr_WindowImpl[0xd])(pWVar1,1);
  }
  VVar2.x = (*this->m_impl->_vptr_WindowImpl[5])();
  VVar2.y = extraout_var;
  this->m_size = VVar2;
  (*this->_vptr_WindowBase[5])(this);
  return;
}

Assistant:

void WindowBase::initialize()
{
    // Setup default behaviors (to get a consistent behavior across different implementations)
    setVisible(true);
    setMouseCursorVisible(true);
    setKeyRepeatEnabled(true);

    // Get and cache the initial size of the window
    m_size = m_impl->getSize();

    // Notify the derived class
    onCreate();
}